

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O1

void __thiscall
Diligent::ResourceMappingImpl::RemoveResourceByName
          (ResourceMappingImpl *this,Char *Name,Uint32 ArrayIndex)

{
  SpinLock *this_00;
  byte bVar1;
  ResMappingHashKey local_48;
  
  if (*Name != '\0') {
    this_00 = &this->m_Lock;
    LOCK();
    bVar1 = (this->m_Lock).m_IsLocked._M_base._M_i;
    (this->m_Lock).m_IsLocked._M_base._M_i = true;
    UNLOCK();
    while ((bVar1 & 1) != 0) {
      Threading::SpinLock::Wait(this_00);
      LOCK();
      bVar1 = (this_00->m_IsLocked)._M_base._M_i;
      (this_00->m_IsLocked)._M_base._M_i = true;
      UNLOCK();
    }
    ResMappingHashKey::ResMappingHashKey(&local_48,Name,false,ArrayIndex);
    std::
    _Hashtable<Diligent::ResourceMappingImpl::ResMappingHashKey,_std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::STDAllocator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,_Diligent::HashMapStringKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->m_HashTable)._M_h,&local_48);
    if ((local_48.super_HashMapStringKey.Str != (Char *)0x0) &&
       ((long)local_48.super_HashMapStringKey.Ownership_Hash < 0)) {
      operator_delete__(local_48.super_HashMapStringKey.Str);
    }
    Threading::SpinLock::unlock(this_00);
  }
  return;
}

Assistant:

void ResourceMappingImpl::RemoveResourceByName(const Char* Name, Uint32 ArrayIndex)
{
    if (*Name == 0)
        return;

    Threading::SpinLockGuard Guard{m_Lock};
    // Remove object with the given name
    // Name will be implicitly converted to HashMapStringKey without making a copy
    m_HashTable.erase(ResMappingHashKey{Name, false, ArrayIndex});
}